

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O1

int my_stricmp(char *s1,char *s2)

{
  int iVar1;
  int iVar2;
  __int32_t **pp_Var3;
  long lVar4;
  
  pp_Var3 = __ctype_tolower_loc();
  lVar4 = 0;
  do {
    iVar1 = (*pp_Var3)[s1[lVar4]];
    iVar2 = (*pp_Var3)[s2[lVar4]];
    if (((long)s2[lVar4] == 0) || (s1[lVar4] == '\0')) break;
    lVar4 = lVar4 + 1;
  } while (iVar1 == iVar2);
  return iVar1 - iVar2;
}

Assistant:

int my_stricmp(const char *s1, const char *s2)
{
    char c1, c2;
    int v;

    while(1) {
        c1 = *s1++;
        c2 = *s2++;
        v = tolower(c1) - tolower(c2);
        if (v != 0 || c1 == 0 || c2 == 0) break;
    }

    return v;
}